

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

ActionObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateActionObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,Index agentI)

{
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this_00;
  pointer *ppuVar1;
  pointer *this_01;
  vector<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>> *this_02;
  uint uVar2;
  iterator iVar3;
  iterator iVar4;
  iterator __position;
  PlanningUnitMADPDiscrete *pPVar5;
  long lVar6;
  int iVar7;
  Index IVar8;
  undefined4 extraout_var;
  ulong uVar9;
  ActionObservationHistory *pAVar10;
  ActionObservationHistoryTree *pAVar11;
  ostream *this_03;
  long *plVar12;
  ActionObservationHistory *this_04;
  ulong uVar13;
  Index oI;
  ActionObservationHistoryTree *aoht;
  ActionObservationHistoryTree *next_aoht;
  ActionObservationHistoryTree *root;
  queue<ActionObservationHistoryTree_*,_std::deque<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>
  aohtQueue;
  uint local_c8;
  uint local_c4;
  ActionObservationHistoryTree *local_c0;
  PlanningUnitMADPDiscrete *local_b8;
  ActionObservationHistoryTree *local_b0;
  long local_a8;
  size_t local_a0;
  ulong local_98;
  ActionObservationHistoryTree *local_90;
  _Deque_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
  ::_M_initialize_map(&local_88,0);
  local_a0 = (this->super_PlanningUnit)._m_horizon;
  iVar7 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,(ulong)agentI);
  local_98 = CONCAT44(extraout_var,iVar7);
  local_b8 = this;
  uVar9 = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
  pAVar10 = (ActionObservationHistory *)operator_new(0x30);
  ActionObservationHistory::ActionObservationHistory(pAVar10,local_b8,agentI);
  pAVar11 = (ActionObservationHistoryTree *)operator_new(0x60);
  ActionObservationHistoryTree::ActionObservationHistoryTree(pAVar11,pAVar10,A_SUC);
  local_90 = pAVar11;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>::
    _M_push_back_aux<ActionObservationHistoryTree*const&>
              ((deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>> *
               )&local_88,&local_90);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = pAVar11;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_a8 = (ulong)agentI * 3;
  this_00 = (local_b8->_m_firstAOHIforT).
            super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + agentI;
  local_c0 = (ActionObservationHistoryTree *)0x0;
  iVar3._M_current =
       (this_00->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this_00->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    _M_realloc_insert<unsigned_long_long>(this_00,iVar3,(unsigned_long_long *)&local_c0);
  }
  else {
    *iVar3._M_current = 0;
    (this_00->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  local_a0 = local_a0 - 1;
  local_c4 = 0;
  local_c8 = 0;
  while (lVar6 = local_a8, pPVar5 = local_b8,
        ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x40 != 0) {
    local_c0 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    pAVar10 = ActionObservationHistoryTree::GetActionObservationHistory(local_c0);
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    uVar2 = (uint)(pAVar10->super_IndividualHistory).super_History._m_length;
    if (local_c4 != uVar2) {
      IVar8 = Globals::CastLIndexToIndex
                        ((&(((local_b8->_m_firstAOHIforT).
                             super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           )._M_impl.super__Vector_impl_data._M_start)[local_a8][local_c4]);
      local_b0 = (ActionObservationHistoryTree *)(ulong)(local_c8 - IVar8);
      ppuVar1 = &(((local_b8->_m_nrActionObservationHistoriesT).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start + local_a8;
      iVar4._M_current = ppuVar1[1];
      if (iVar4._M_current == ppuVar1[2]) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar1,iVar4,
                   (unsigned_long *)&local_b0);
      }
      else {
        *iVar4._M_current = (unsigned_long)local_b0;
        ppuVar1[1] = iVar4._M_current + 1;
      }
      local_c4 = local_c4 + 1;
      if (local_c4 != uVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: CreateActionObservationHistories:  ++ts != ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"(Index) thisLength !!! ts (now) is: ",0x24);
        this_03 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(this_03,"thisLength-1  =",0xf);
        plVar12 = (long *)std::ostream::operator<<((ostream *)this_03,uVar2 - 1);
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        std::ostream::flush();
      }
      this_01 = &(((local_b8->_m_firstAOHIforT).
                   super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_start + local_a8;
      local_b0 = (ActionObservationHistoryTree *)(ulong)local_c8;
      iVar3._M_current = this_01[1];
      if (iVar3._M_current == this_01[2]) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>
                  ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this_01,iVar3,
                   (unsigned_long_long *)&local_b0);
      }
      else {
        *iVar3._M_current = (unsigned_long_long)local_b0;
        this_01[1] = iVar3._M_current + 1;
      }
    }
    ActionObservationHistoryTree::SetIndex(local_c0,local_c8);
    this_02 = (vector<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>> *
              )(&(((local_b8->_m_actionObservationHistoryTreeVectors).
                   super__Vector_base<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>,_std::allocator<std::vector<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_a8);
    __position._M_current = *(ActionObservationHistoryTree ***)(this_02 + 8);
    if (__position._M_current == *(ActionObservationHistoryTree ***)(this_02 + 0x10)) {
      std::vector<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>::
      _M_realloc_insert<ActionObservationHistoryTree*const&>(this_02,__position,&local_c0);
    }
    else {
      *__position._M_current = local_c0;
      *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
    }
    if ((pAVar10->super_IndividualHistory).super_History._m_length < local_a0 && local_98 != 0) {
      uVar13 = 0;
      do {
        IVar8 = (Index)uVar13;
        if (uVar9 != 0) {
          uVar13 = 0;
          do {
            this_04 = (ActionObservationHistory *)operator_new(0x30);
            oI = (Index)uVar13;
            ActionObservationHistory::ActionObservationHistory(this_04,IVar8,oI,pAVar10);
            pAVar11 = (ActionObservationHistoryTree *)operator_new(0x60);
            ActionObservationHistoryTree::ActionObservationHistoryTree(pAVar11,this_04,A_SUC);
            local_b0 = pAVar11;
            ActionObservationHistoryTree::SetSuccessor(local_c0,IVar8,oI,pAVar11);
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::
              deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>::
              _M_push_back_aux<ActionObservationHistoryTree*const&>
                        ((deque<ActionObservationHistoryTree*,std::allocator<ActionObservationHistoryTree*>>
                          *)&local_88,&local_b0);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_b0;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            uVar13 = (ulong)(oI + 1);
          } while (uVar13 < uVar9);
        }
        uVar13 = (ulong)(IVar8 + 1);
      } while (uVar13 < local_98);
    }
    local_c8 = local_c8 + 1;
  }
  IVar8 = Globals::CastLIndexToIndex
                    ((&(((local_b8->_m_firstAOHIforT).
                         super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                       _M_impl.super__Vector_impl_data._M_start)[local_a8][local_c4]);
  local_c0 = (ActionObservationHistoryTree *)(ulong)(local_c8 - IVar8);
  ppuVar1 = &(((pPVar5->_m_nrActionObservationHistoriesT).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar6;
  iVar4._M_current = ppuVar1[1];
  if (iVar4._M_current == ppuVar1[2]) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ppuVar1,iVar4,
               (unsigned_long *)&local_c0);
  }
  else {
    *iVar4._M_current = (unsigned_long)local_c0;
    ppuVar1[1] = iVar4._M_current + 1;
  }
  local_c0 = (ActionObservationHistoryTree *)(ulong)local_c8;
  iVar4._M_current =
       (pPVar5->_m_nrActionObservationHistories).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pPVar5->_m_nrActionObservationHistories).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&pPVar5->_m_nrActionObservationHistories,iVar4,(unsigned_long *)&local_c0);
  }
  else {
    *iVar4._M_current = (unsigned_long)local_c0;
    (pPVar5->_m_nrActionObservationHistories).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  pAVar11 = local_90;
  std::_Deque_base<ActionObservationHistoryTree_*,_std::allocator<ActionObservationHistoryTree_*>_>
  ::~_Deque_base(&local_88);
  return pAVar11;
}

Assistant:

ActionObservationHistoryTree* PlanningUnitMADPDiscrete::
    CreateActionObservationHistoryTree(Index agentI)
{
    queue<ActionObservationHistoryTree*> aohtQueue;
    
    Index aohI = 0;
    size_t maxLength = GetHorizon() - 1;
    size_t nrA = GetNrActions(agentI);
    size_t nrO = GetNrObservations(agentI);

    //initial ActionObservationHistory aoh_0
    ActionObservationHistory* aoh_0 =new ActionObservationHistory(*this,agentI);
    ActionObservationHistoryTree* root =new ActionObservationHistoryTree(aoh_0);

    aohtQueue.push(root);

    Index ts = 0;
    _m_firstAOHIforT[agentI].push_back(aohI);
    while(aohtQueue.size() >= 1)
    {
        //  aoh = queue.pop
        ActionObservationHistoryTree* aoht = aohtQueue.front();
        ActionObservationHistory* aoh = aoht->GetActionObservationHistory();
        aohtQueue.pop();

        int thisLength = aoh->GetLength(); 
        if(ts != (Index) thisLength  ) //length 0 <-> ts 0 
        {
            // we've now started processing AOHs for the next ts
            Index nr_AOHI_for_ts = aohI - 
                CastLIndexToIndex(_m_firstAOHIforT[agentI][ts]);
#if DEBUG_PUDCAOHT
            cout << "First aoh for next ts+1: store nr of ts-OH..."<<endl<<
                "_m_firstAOHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstAOHIforT[agentI][ts] << ", current AOHI = " <<
                aohI << endl;
            Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif                
            _m_nrActionObservationHistoriesT[agentI].push_back(nr_AOHI_for_ts); 
#if DEBUG_PUDCAOHT
            cout << 
                "Set _m_nrActionObservationHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_AOHI_for_ts <<endl;
#endif
            if(++ts != (Index) thisLength)
                cerr << "ERROR: CreateActionObservationHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength-1  =" << thisLength-1 <<endl;            
            _m_firstAOHIforT[agentI].push_back(aohI);            
        }
        //  aoh.SetIndex(index++)
        aoht->SetIndex(aohI++);        
        _m_actionObservationHistoryTreeVectors[agentI].push_back(aoht);
        
        if(aoh->GetLength() >= maxLength )
            //this is a final action-obs history:
            continue;
        //else

        for(Index aI = 0; aI < nrA; aI++)
            for(Index oI = 0; oI < nrO; oI++)
            {
                //Constructor gets act. and obs. history and extends them
                //with aI, oI. to find new ones,
                ActionObservationHistory* next_aoh =
                    new ActionObservationHistory(aI, oI, aoh);
#if DEBUG_PUDCAOHT
                cout << "created new aoh (for aI="<<aI<<", oI="<<oI<<":"<<
                    endl; 
                next_aoh->Print();
                cout << endl;
#endif

                ActionObservationHistoryTree* next_aoht =
                    new ActionObservationHistoryTree(next_aoh);
#if DEBUG_PUDCAOHT
                cout << "\ncreated new aoh tree:"<<endl; 
                next_aoht->Print();
                cout << endl;
#endif

                aoht->SetSuccessor(aI, oI, next_aoht);
                aohtQueue.push(next_aoht);
            }

    }
    Index nr_AOHI_for_ts = aohI - CastLIndexToIndex(_m_firstAOHIforT[agentI][ts]);
    _m_nrActionObservationHistoriesT[agentI].push_back(nr_AOHI_for_ts);
    _m_nrActionObservationHistories.push_back(aohI);

    return(root);
}